

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void CVmImageLoader::save_synth_export_cb(void *ctx0,CVmHashEntry *entry0)

{
  CVmFile *this;
  CVmHashEntry *in_RSI;
  undefined8 *in_RDI;
  char buf [5];
  CVmHashEntryExport *entry;
  synth_save_cb_ctx *ctx;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  CVmFile *this_00;
  char *buf_00;
  
  this_00 = (CVmFile *)*in_RDI;
  CVmHashEntry::getlen(in_RSI);
  CVmFile::write_uint2(this_00,in_stack_ffffffffffffffbc);
  buf_00 = (char *)*in_RDI;
  this = (CVmFile *)CVmHashEntry::getstr(in_RSI);
  CVmHashEntry::getlen(in_RSI);
  CVmFile::write_bytes(this,buf_00,(size_t)this_00);
  vmb_put_dh((char *)this_00,
             (vm_val_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  CVmFile::write_bytes(this,buf_00,(size_t)this_00);
  in_RDI[1] = in_RDI[1] + 1;
  return;
}

Assistant:

void CVmImageLoader::save_synth_export_cb(void *ctx0, CVmHashEntry *entry0)
{
    synth_save_cb_ctx *ctx = (synth_save_cb_ctx *)ctx0;
    CVmHashEntryExport *entry = (CVmHashEntryExport *)entry0;
    char buf[VMB_DATAHOLDER];

    /* write this entry's length and name to the file */
    ctx->fp->write_uint2(entry->getlen());
    ctx->fp->write_bytes(entry->getstr(), entry->getlen());

    /* write the value as a dataholder */
    vmb_put_dh(buf, &entry->val_);
    ctx->fp->write_bytes(buf, VMB_DATAHOLDER);

    /* count the entry */
    ++(ctx->cnt);
}